

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

bool __thiscall asmjit::StringBuilder::eq(StringBuilder *this,char *str,size_t len)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  bool bVar5;
  
  sVar2 = this->_length;
  if (len == 0xffffffffffffffff) {
    sVar4 = 0;
    while (sVar2 != sVar4) {
      pcVar1 = str + sVar4;
      if (this->_data[sVar4] != *pcVar1) {
        return false;
      }
      sVar4 = sVar4 + 1;
      if (*pcVar1 == '\0') {
        return false;
      }
    }
    bVar5 = str[sVar2] == '\0';
  }
  else if (sVar2 == len) {
    iVar3 = bcmp(this->_data,str,len);
    bVar5 = iVar3 == 0;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool StringBuilder::eq(const char* str, size_t len) const noexcept {
  const char* aData = _data;
  const char* bData = str;

  size_t aLength = _length;
  size_t bLength = len;

  if (bLength == Globals::kInvalidIndex) {
    size_t i;
    for (i = 0; i < aLength; i++)
      if (aData[i] != bData[i] || bData[i] == 0)
        return false;
    return bData[i] == 0;
  }
  else {
    if (aLength != bLength)
      return false;
    return ::memcmp(aData, bData, aLength) == 0;
  }
}